

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O1

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
booster::locale::dpgettext<wchar_t>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,char *domain,wchar_t *context,wchar_t *id,locale *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar3;
  allocator local_c9;
  string local_c8;
  basic_message<wchar_t> local_a8;
  
  paVar1 = &local_a8.id_.field_2;
  local_a8.n_ = 0;
  local_a8.c_plural_ = (char_type_conflict *)0x0;
  local_a8.id_._M_string_length = 0;
  local_a8.id_.field_2._M_local_buf[0] = L'\0';
  paVar2 = &local_a8.context_.field_2;
  local_a8.context_._M_string_length = 0;
  local_a8.context_.field_2._M_local_buf[0] = L'\0';
  paVar3 = &local_a8.plural_.field_2;
  local_a8.plural_._M_string_length = 0;
  local_a8.plural_.field_2._M_local_buf[0] = L'\0';
  local_a8.c_id_ = id;
  local_a8.c_context_ = context;
  local_a8.id_._M_dataplus._M_p = (pointer)paVar1;
  local_a8.context_._M_dataplus._M_p = (pointer)paVar2;
  local_a8.plural_._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::string((string *)&local_c8,domain,&local_c9);
  basic_message<wchar_t>::str(__return_storage_ptr__,&local_a8,loc,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8.plural_._M_dataplus._M_p != paVar3) {
    operator_delete(local_a8.plural_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8.context_._M_dataplus._M_p != paVar2) {
    operator_delete(local_a8.context_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a8.id_._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.id_._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharType>  dpgettext( char const *domain,
                                                CharType const *context,
                                                CharType const *id,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(context,id).str(loc,domain);
        }